

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryPushNonJavascriptArray
              (ScriptContext *scriptContext,Var *args,uint argCount)

{
  Type TVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  uint64 uVar8;
  Var newValue;
  ulong uVar9;
  undefined1 local_a0 [8];
  ThrowTypeErrorOnFailureHelper h;
  undefined1 auStack_88 [8];
  BigIndex n;
  BigIndex big;
  JsReentLock jsReentLock;
  RecyclableObject *obj;
  
  big.bigIndex = (uint64)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)big.bigIndex)->noJsReentrancy;
  ((ThreadContext *)big.bigIndex)->noJsReentrancy = true;
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  h.m_functionName = (PCWSTR)args;
  BVar5 = JavascriptConversion::ToObject
                    (*args,scriptContext,(RecyclableObject **)&jsReentLock.m_savedNoJsReentrancy);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.push");
  }
  JsReentLock::setObjectForMutation((JsReentLock *)&big.bigIndex,(Var)jsReentLock._24_8_);
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  obj = (RecyclableObject *)JavascriptOperators::OP_GetLength((Var)jsReentLock._24_8_,scriptContext)
  ;
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a49308;
    *puVar7 = 0;
  }
  bVar4 = TaggedInt::Is(obj);
  if ((ulong)obj >> 0x32 == 0 && !bVar4) {
    this = UnsafeVarTo<Js::RecyclableObject>(obj);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a49308;
      *puVar7 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (((TVar1 == TypeIds_Undefined) &&
          ((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
           DisableImplicitNoFlag)) &&
         (scriptContext->threadContext->implicitCallFlags != ImplicitCall_None)) goto LAB_00a492d3;
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00a49308:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940e54;
  local_a0 = (undefined1  [8])scriptContext;
  BigIndex::BigIndex((BigIndex *)auStack_88,0);
  if (((scriptContext->config).threadConfig)->m_ES6ToLength == true) {
    uVar8 = JavascriptConversion::ToLength(obj,scriptContext);
    BigIndex::BigIndex((BigIndex *)&n.bigIndex,uVar8);
  }
  else {
    uVar6 = JavascriptConversion::ToUInt32(obj,scriptContext);
    BigIndex::BigIndex((BigIndex *)&n.bigIndex,uVar6);
  }
  auStack_88 = (undefined1  [8])n.bigIndex;
  n.index = big.index;
  n._4_4_ = big._4_4_;
  obj = (RecyclableObject *)0x0;
  for (uVar9 = 1; uVar9 < argCount; uVar9 = uVar9 + 1) {
    BigIndex::BigIndex((BigIndex *)&n.bigIndex,0xffffffff);
    bVar4 = BigIndex::operator<((BigIndex *)auStack_88,(BigIndex *)&n.bigIndex);
    uVar3 = jsReentLock._24_8_;
    if (!bVar4) {
      n.bigIndex = (uint64)auStack_88;
      big.index = n.index;
      big._4_4_ = n._4_4_;
      obj = (RecyclableObject *)0x0;
      goto LAB_00a49148;
    }
    *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    uVar6 = BigIndex::GetSmallIndex((BigIndex *)auStack_88);
    BVar5 = JavascriptOperators::SetItem
                      ((Var)uVar3,(RecyclableObject *)uVar3,uVar6,
                       *(Var *)(h.m_functionName + uVar9 * 4),scriptContext,
                       PropertyOperation_ThrowIfNotExtensible,0);
    JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
    *(undefined1 *)(big.bigIndex + 0x108) = 1;
    if (BVar5 == 0) {
      bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
      if (!bVar4) goto LAB_00a492d3;
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_a0);
    }
    if (auStack_88._0_4_ == 0xffffffff) {
      n._0_8_ = n._0_8_ + 1;
    }
    else {
      auStack_88._0_4_ = auStack_88._0_4_ + 1;
    }
  }
  if (auStack_88._0_4_ == 0xffffffff) {
    uVar8 = BigIndex::GetBigIndex((BigIndex *)auStack_88);
  }
  else {
    uVar6 = BigIndex::GetSmallIndex((BigIndex *)auStack_88);
    uVar8 = (uint64)uVar6;
  }
  obj = (RecyclableObject *)JavascriptNumber::ToVar(uVar8,scriptContext);
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar5 = JavascriptOperators::SetProperty
                    ((Var)jsReentLock._24_8_,(RecyclableObject *)jsReentLock._24_8_,0xd1,obj,
                     scriptContext,PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
  *(undefined1 *)(big.bigIndex + 0x108) = 1;
  if (BVar5 != 0) goto LAB_00a492d3;
  bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
  if (bVar4) {
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_a0);
    goto LAB_00a492d3;
  }
LAB_00a492cb:
  obj = (RecyclableObject *)0x0;
LAB_00a492d3:
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return obj;
LAB_00a49148:
  uVar3 = jsReentLock._24_8_;
  *(undefined1 *)(big.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  if (argCount <= uVar9) goto LAB_00a491d1;
  BVar5 = BigIndex::SetItem((BigIndex *)&n.bigIndex,(RecyclableObject *)jsReentLock._24_8_,
                            *(Var *)(h.m_functionName + uVar9 * 4),
                            PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
  *(undefined1 *)(big.bigIndex + 0x108) = 1;
  if (BVar5 == 0) {
    bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (!bVar4) goto LAB_00a492d3;
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_a0);
  }
  if ((int)n.bigIndex == -1) {
    big._0_8_ = big._0_8_ + 1;
  }
  else {
    n.bigIndex = CONCAT44(n.bigIndex._4_4_,(int)n.bigIndex + 1);
  }
  uVar9 = uVar9 + 1;
  goto LAB_00a49148;
LAB_00a491d1:
  newValue = BigIndex::ToNumber((BigIndex *)&n.bigIndex,scriptContext);
  BVar5 = JavascriptOperators::SetProperty
                    ((Var)uVar3,(RecyclableObject *)uVar3,0xd1,newValue,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)&big.bigIndex);
  *(undefined1 *)(big.bigIndex + 0x108) = 1;
  if (BVar5 == 0) {
    bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (!bVar4) goto LAB_00a492cb;
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_a0);
  }
  obj = (RecyclableObject *)BigIndex::ToNumber((BigIndex *)&n.bigIndex,scriptContext);
  goto LAB_00a492d3;
}

Assistant:

Var JavascriptArray::EntryPushNonJavascriptArray(ScriptContext * scriptContext, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.push"));
        }
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        JS_REENTRANT_UNLOCK(jsReentLock, Var length = JavascriptOperators::OP_GetLength(obj, scriptContext));
        if(JavascriptOperators::GetTypeId(length) == TypeIds_Undefined && scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != Js::ImplicitCall_None)
        {
            return length;
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));
        BigIndex n;
        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
        {
            n = (uint64) JavascriptConversion::ToLength(length, scriptContext);
        }
        else
        {
            n = JavascriptConversion::ToUInt32(length, scriptContext);
        }
        // First handle "small" indices.
        uint index;
        for (index=1; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            JS_REENTRANT(jsReentLock,
                BOOL setItem = JavascriptOperators::SetItem(obj, obj, n.GetSmallIndex(), args[index], scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setItem))
            {
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            BigIndex big = n;

            for (; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, BOOL setItem = big.SetItem(obj, args[index], PropertyOperation_ThrowIfNotExtensible));
                if (h.IsThrowTypeError(setItem))
                {
                    if(scriptContext->GetThreadContext()->RecordImplicitException())
                    {
                        h.ThrowTypeErrorOnFailure();
                    }
                    else
                    {
                        return nullptr;
                    }
                }

            }

            // Set the new length; for objects it is all right for this to be >= MaxArrayLength
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, big.ToNumber(scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return big.ToNumber(scriptContext);
        }
        else
        {
            // Set the new length
            Var lengthAsNUmberVar = JavascriptNumber::ToVar(n.IsSmallIndex() ? n.GetSmallIndex() : n.GetBigIndex(), scriptContext);
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, lengthAsNUmberVar, scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return lengthAsNUmberVar;
        }
    }